

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall ON_SimpleArray<ON_Curve_*>::Reverse(ON_SimpleArray<ON_Curve_*> *this)

{
  ON_Curve *pOVar1;
  int local_20;
  int local_1c;
  int j;
  int i;
  ON_Curve *t;
  ON_SimpleArray<ON_Curve_*> *this_local;
  
  local_1c = 0;
  local_20 = this->m_count;
  for (; local_20 = local_20 + -1, local_1c < local_20; local_1c = local_1c + 1) {
    pOVar1 = this->m_a[local_1c];
    this->m_a[local_1c] = this->m_a[local_20];
    this->m_a[local_20] = pOVar1;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Reverse()
{
  // NOTE:
  // If anything in "T" depends on the value of this's address,
  // then don't call Reverse().
  T t;
  int i = 0;  
  int j = m_count-1;
  for ( /*empty*/; i < j; i++, j-- ) {
    t = m_a[i];
    m_a[i] = m_a[j];
    m_a[j] = t;
  }
}